

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

int regstrcmp(SXML_CHAR *str,SXML_CHAR *pattern)

{
  char cVar1;
  char cVar2;
  char *local_30;
  SXML_CHAR *s;
  SXML_CHAR *p;
  SXML_CHAR *pattern_local;
  SXML_CHAR *str_local;
  
  if ((str == (SXML_CHAR *)0x0) && (pattern == (SXML_CHAR *)0x0)) {
    str_local._4_4_ = 1;
  }
  else if ((str == (SXML_CHAR *)0x0) || (local_30 = str, s = pattern, pattern == (SXML_CHAR *)0x0))
  {
    str_local._4_4_ = 0;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          cVar1 = *s;
          if (cVar1 == '\0') {
            return (uint)(*local_30 == '\0');
          }
          if (cVar1 != '*') break;
          for (; (*s != '\0' && ((*s == '*' || (*s == '?')))); s = s + 1) {
          }
          for (; (*local_30 != '\0' && (*local_30 != *s)); local_30 = local_30 + 1) {
          }
        }
        if (cVar1 != '?') break;
        local_30 = local_30 + 1;
        s = s + 1;
      }
      if (*s == '\\') {
        s = s + 1;
      }
      cVar1 = *s;
      cVar2 = *local_30;
      local_30 = local_30 + 1;
      s = s + 1;
    } while (cVar1 == cVar2);
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

int regstrcmp(SXML_CHAR* str, SXML_CHAR* pattern)
{
	SXML_CHAR *p, *s;

	if (str == NULL && pattern == NULL)
		return TRUE;

	if (str == NULL || pattern == NULL)
		return FALSE;

	p = pattern;
	s = str;
	for (;;) {
		switch (*p) {
			/* Any character matches, go to next one */
			case C2SX('?'):
				p++;
				s++;
				break;

			/* Go to next character in pattern and wait until it is found in 'str' */
			case C2SX('*'):
				for (; *p != NULC; p++) { /* Squeeze '**?*??**' to '*' */
					if (*p != C2SX('*') && *p != C2SX('?'))
						break;
				}
				for (; *s != NULC; s++) {
					if (*s == *p)
						break;
				}
				break;

			/* NULL character on pattern has to be matched by 'str' */
			case 0:
				return *s ? FALSE : TRUE;

			default:
				if (*p == C2SX('\\')) /* Escape character */
					p++;
				if (*p++ != *s++) /* Characters do not match */
					return FALSE;
				break;
		}
	}

	return FALSE;
}